

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  const_reference ppLVar4;
  Mat *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  int unaff_retaddr;
  Mat top_blob_g_1;
  Option opt_g_2;
  int p_1;
  Mat top_blob_g;
  Mat top_blob_tm_g;
  Option opt_g_1;
  int p;
  Mat top_blob_tm;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  size_t elemsize;
  int channels;
  int h;
  int w;
  conv_int8_requant_func conv_int8_requant;
  conv_int8_dequant_func conv_int8_dequant;
  conv_func conv;
  conv_int8_requant_func conv_int8_requant_func_table [7] [4];
  conv_int8_dequant_func conv_int8_dequant_func_table [7] [4];
  conv_func conv_func_table [7] [4];
  int stride;
  int kernel_size;
  int in_stack_00000700;
  int in_stack_00000704;
  Mat *in_stack_00000708;
  Mat *in_stack_00000710;
  Mat *in_stack_00000718;
  Mat *in_stack_00000720;
  int in_stack_00000730;
  int in_stack_00000738;
  Option *in_stack_00000740;
  Option *in_stack_00000780;
  Mat *in_stack_00000788;
  Mat *in_stack_00000790;
  Convolution *in_stack_00000798;
  Mat *in_stack_fffffffffffff9d0;
  Mat *in_stack_fffffffffffff9d8;
  undefined4 uVar5;
  int in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  int in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  Mat *in_stack_fffffffffffff9f0;
  code *pcVar6;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa18;
  vector<float,_std::allocator<float>_> *pvVar7;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa20;
  undefined1 local_5b0 [24];
  undefined1 local_598 [64];
  undefined4 local_558;
  undefined4 uStack_554;
  Allocator *pAStack_550;
  size_t local_548;
  undefined8 uStack_540;
  Allocator *local_538;
  int local_524;
  undefined1 local_520 [24];
  undefined1 local_508 [64];
  undefined1 local_4c8 [64];
  undefined4 local_488;
  undefined4 uStack_484;
  Allocator *pAStack_480;
  size_t local_478;
  undefined8 uStack_470;
  Allocator *local_468;
  int local_45c;
  Mat local_458;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  Mat local_408;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  Allocator *pAStack_3c0;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  int iStack_3b0;
  undefined4 uStack_3ac;
  Allocator *local_3a8;
  uint local_398;
  Mat local_388;
  Mat local_348;
  size_t local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  vector<float,_std::allocator<float>_> *local_2f0;
  code *local_2e8;
  long local_2e0;
  long local_2d8 [28];
  undefined8 local_1f8 [28];
  long local_118 [27];
  float in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int bottom;
  int type;
  long *plVar8;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  if (in_RSI->dims != 3) {
    iVar3 = Convolution::forward
                      (in_stack_00000798,in_stack_00000790,in_stack_00000788,in_stack_00000780);
    return iVar3;
  }
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) !=
       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88)) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) !=
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98))) {
    iVar3 = Convolution::forward
                      (in_stack_00000798,in_stack_00000790,in_stack_00000788,in_stack_00000780);
    return iVar3;
  }
  iVar3 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84);
  bottom = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94);
  if (((7 < iVar3) || (7 < bottom)) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) !=
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90))) {
    iVar3 = Convolution::forward
                      (in_stack_00000798,in_stack_00000790,in_stack_00000788,in_stack_00000780);
    return iVar3;
  }
  plVar8 = in_RDI;
  memcpy(local_118,&PTR_conv1x1s1_sse_001be0d0,0xe0);
  type = (int)plVar8;
  memcpy(local_1f8,&PTR_conv1x1s1_int8_dequant_sse_001be1b0,0xe0);
  memcpy(local_2d8,&PTR_conv1x1s1_int8_requant_sse_001be290,0xe0);
  local_2e0 = 0;
  local_2e8 = (code *)0x0;
  local_2f0 = (vector<float,_std::allocator<float>_> *)0x0;
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) & 1) == 0) {
    local_2e0 = local_118[(long)(iVar3 + -1) * 4 + (long)(bottom + -1)];
    if (local_2e0 == 0) {
      iVar3 = Convolution::forward
                        (in_stack_00000798,in_stack_00000790,in_stack_00000788,in_stack_00000780);
      return iVar3;
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) != 1) {
      if (bottom != 1) {
        iVar3 = Convolution::forward
                          (in_stack_00000798,in_stack_00000790,in_stack_00000788,in_stack_00000780);
        return iVar3;
      }
      iVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,local_2e0,in_RCX);
      return iVar3;
    }
  }
  else {
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c1) & 1) == 0) {
      local_2e8 = (code *)local_1f8[(long)(iVar3 + -1) * 4 + (long)(bottom + -1)];
    }
    else {
      local_2f0 = (vector<float,_std::allocator<float>_> *)
                  local_2d8[(long)(iVar3 + -1) * 4 + (long)(bottom + -1)];
    }
    if ((local_2f0 == (vector<float,_std::allocator<float>_> *)0x0) && (local_2e8 == (code *)0x0)) {
      iVar3 = Convolution::forward
                        (in_stack_00000798,in_stack_00000790,in_stack_00000788,in_stack_00000780);
      return iVar3;
    }
  }
  local_2f4 = in_RSI->w;
  local_2f8 = in_RSI->h;
  local_2fc = in_RSI->c;
  local_308 = in_RSI->elemsize;
  Mat::Mat(&local_348,in_RSI);
  if (((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) & 1) != 0) && (local_308 != 1))
  {
    Mat::Mat(&local_388);
    Mat::create(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8,
                in_stack_fffffffffffff9e4,(size_t)in_stack_fffffffffffff9d8,
                (Allocator *)in_stack_fffffffffffff9d0);
    bVar2 = Mat::empty(in_stack_fffffffffffff9d0);
    if (bVar2) {
      in_stack_fffffffffffffffc = -100;
    }
    else {
      local_3a8 = in_RCX->allocator;
      local_3c8 = *(undefined4 *)&in_RCX->data;
      uStack_3c4 = *(undefined4 *)((long)&in_RCX->data + 4);
      local_3b8 = (undefined4)in_RCX->elemsize;
      uStack_3b4 = *(undefined4 *)((long)&in_RCX->elemsize + 4);
      iStack_3b0 = in_RCX->packing;
      uStack_3ac = *(undefined4 *)&in_RCX->field_0x1c;
      pAStack_3c0 = local_388.allocator;
      plVar8 = *(long **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c8);
      (**(code **)(*plVar8 + 0x38))(plVar8,in_RSI,&local_388,&local_3c8);
      Mat::operator=(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    }
    local_398 = (uint)bVar2;
    Mat::~Mat((Mat *)0x13bb23);
    if (local_398 != 0) goto LAB_0013c6a7;
  }
  Mat::Mat(&local_408,&local_348);
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) < 1) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) < 1)) {
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) == -0xe9) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) == -0xe9)) {
      local_40c = (iVar3 + ((local_2f4 + -1) / bottom) * bottom) - local_2f4;
      local_410 = (iVar3 + ((local_2f8 + -1) / bottom) * bottom) - local_2f8;
      if ((0 < local_40c) || (0 < local_410)) {
        in_stack_fffffffffffff9d0 = (Mat *)in_RCX->elemsize;
        in_stack_fffffffffffff9d8 = (Mat *)CONCAT44(uVar5,*(undefined4 *)((long)&in_RCX->data + 4));
        copy_make_border(in_RDX,in_RCX,iVar3,bottom,in_stack_ffffffffffffffcc,
                         in_stack_ffffffffffffffc8,type,in_stack_ffffffffffffffc4,
                         (Allocator *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         unaff_retaddr);
        bVar2 = Mat::empty(in_stack_fffffffffffff9d0);
        if (bVar2) {
          in_stack_fffffffffffffffc = -100;
          local_398 = 1;
          goto LAB_0013c689;
        }
      }
      local_2f4 = local_408.w;
      local_2f8 = local_408.h;
    }
LAB_0013bdde:
    local_414 = (local_2f4 - iVar3) / bottom + 1;
    local_418 = (local_2f8 - iVar3) / bottom + 1;
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) & 1) == 0) {
      Mat::create(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8,
                  in_stack_fffffffffffff9e4,(size_t)in_stack_fffffffffffff9d8,
                  (Allocator *)in_stack_fffffffffffff9d0);
      bVar2 = Mat::empty(in_stack_fffffffffffff9d0);
      if (bVar2) {
        in_stack_fffffffffffffffc = -100;
        local_398 = 1;
      }
      else {
        if ((*(byte *)(in_RDI + 2) & 1) == 0) {
          conv_im2col_sgemm_sse
                    (in_stack_00000720,in_stack_00000718,in_stack_00000710,in_stack_00000708,
                     in_stack_00000704,in_stack_00000700,in_stack_00000730,in_stack_00000738,
                     in_stack_00000740);
        }
        else {
          conv3x3s1_winograd43_sse
                    ((Mat *)conv_int8_requant_func_table[0][2],
                     (Mat *)conv_int8_requant_func_table[0][1],
                     (Mat *)conv_int8_requant_func_table[0][0],(Mat *)conv,
                     (Option *)conv_int8_dequant);
        }
        if (in_RDI[1] != 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
        }
        in_stack_fffffffffffffffc = 0;
        local_398 = 1;
      }
    }
    else if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c1) & 1) == 1) {
      Mat::Mat(&local_458);
      Mat::create(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8,
                  in_stack_fffffffffffff9e4,(size_t)in_stack_fffffffffffff9d8,
                  (Allocator *)in_stack_fffffffffffff9d0);
      bVar2 = Mat::empty(in_stack_fffffffffffff9d0);
      if (bVar2) {
        in_stack_fffffffffffffffc = -100;
        local_398 = 1;
      }
      else {
        Mat::create(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8,
                    in_stack_fffffffffffff9e4,(size_t)in_stack_fffffffffffff9d8,
                    (Allocator *)in_stack_fffffffffffff9d0);
        bVar2 = Mat::empty(in_stack_fffffffffffff9d0);
        if (bVar2) {
          in_stack_fffffffffffffffc = -100;
          local_398 = 1;
        }
        else {
          if ((*(byte *)(in_RDI + 2) & 1) == 0) {
            lVar1 = *(long *)(*in_RDI + -0x18);
            pvVar7 = local_2f0;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)in_RDX,local_2f0);
            (*(code *)pvVar7)(&local_408,in_RDX,(long)in_RDI + lVar1 + 0xf8,
                              (long)in_RDI + lVar1 + 0x138,local_520,in_RCX);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
          }
          else {
            conv3x3s1_winograd43_int8_sse
                      ((Mat *)bottom_blob_bordered.data,_hpad,_outh,(Option *)top_blob_tm.cstep);
            for (local_45c = 0;
                local_45c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80);
                local_45c = local_45c + 1) {
              local_468 = in_RCX->allocator;
              local_478 = in_RCX->elemsize;
              uStack_470 = *(undefined8 *)&in_RCX->packing;
              _local_488 = CONCAT44(1,(int)in_RCX->data);
              pAStack_480 = in_RDX->allocator;
              Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8
                                                ),in_stack_fffffffffffff9e4,
                                 in_stack_fffffffffffff9e0);
              Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8
                                                ),in_stack_fffffffffffff9e4,
                                 in_stack_fffffffffffff9e0);
              ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                   ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1e8),
                                   (long)local_45c);
              (*(*ppLVar4)->_vptr_Layer[7])(*ppLVar4,local_4c8,local_508,&local_488);
              Mat::~Mat((Mat *)0x13c0d5);
              Mat::~Mat((Mat *)0x13c0e2);
            }
          }
          local_398 = 0;
        }
      }
      Mat::~Mat((Mat *)0x13c21a);
      if (local_398 == 0) {
LAB_0013c4e8:
        in_stack_fffffffffffffffc = 0;
        local_398 = 1;
      }
    }
    else {
      Mat::create(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8,
                  in_stack_fffffffffffff9e4,(size_t)in_stack_fffffffffffff9d8,
                  (Allocator *)in_stack_fffffffffffff9d0);
      bVar2 = Mat::empty(in_stack_fffffffffffff9d0);
      if (!bVar2) {
        if ((*(byte *)(in_RDI + 2) & 1) == 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          pcVar6 = local_2e8;
          std::vector<float,_std::allocator<float>_>::vector
                    (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
          (*pcVar6)(&local_408,in_RDX,(long)in_RDI + lVar1 + 0xf8,(long)in_RDI + lVar1 + 0x138,
                    local_5b0,in_RCX);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
        }
        else {
          conv3x3s1_winograd43_int8_sse
                    ((Mat *)bottom_blob_bordered.data,_hpad,_outh,(Option *)top_blob_tm.cstep);
          for (local_524 = 0; local_524 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80)
              ; local_524 = local_524 + 1) {
            local_538 = in_RCX->allocator;
            local_548 = in_RCX->elemsize;
            uStack_540 = *(undefined8 *)&in_RCX->packing;
            _local_558 = CONCAT44(1,(int)in_RCX->data);
            pAStack_550 = in_RDX->allocator;
            Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                               in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0);
            ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d0),(long)local_524
                                );
            (*(*ppLVar4)->_vptr_Layer[9])(*ppLVar4,local_598,&local_558);
            Mat::~Mat((Mat *)0x13c3e6);
          }
        }
        goto LAB_0013c4e8;
      }
      in_stack_fffffffffffffffc = -100;
      local_398 = 1;
    }
  }
  else {
    in_stack_fffffffffffff9d0 = (Mat *)in_RCX->elemsize;
    in_stack_fffffffffffff9d8 = (Mat *)CONCAT44(uVar5,*(undefined4 *)((long)&in_RCX->data + 4));
    copy_make_border(in_RDX,in_RCX,iVar3,bottom,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     type,in_stack_ffffffffffffffc4,
                     (Allocator *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     unaff_retaddr);
    bVar2 = Mat::empty(in_stack_fffffffffffff9d0);
    if (!bVar2) {
      local_2f4 = local_408.w;
      local_2f8 = local_408.h;
      goto LAB_0013bdde;
    }
    in_stack_fffffffffffffffc = -100;
    local_398 = 1;
  }
LAB_0013c689:
  Mat::~Mat((Mat *)0x13c696);
LAB_0013c6a7:
  Mat::~Mat((Mat *)0x13c6b4);
  return in_stack_fffffffffffffffc;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;  

    if (kernel_size > 7 || stride > 7 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[7][4] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            conv3x3s2_sse,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            conv5x5s2_sse,
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_sse,          
            conv7x7s2_sse,          
            0,
            0
        }  // kernel_size = 7        
    };

    typedef void (*conv_int8_dequant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);
    typedef void (*conv_int8_requant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);

    // kernel_size x stride
    conv_int8_dequant_func conv_int8_dequant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_dequant_sse,
            conv1x1s2_int8_dequant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_dequant_sse,
            conv3x3s2_int8_dequant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_dequant_sse,
            conv5x5s2_int8_dequant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_dequant_sse,          
            conv7x7s2_int8_dequant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_int8_requant_func conv_int8_requant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_requant_sse,
            conv1x1s2_int8_requant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_requant_sse,
            conv3x3s2_int8_requant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_requant_sse,
            conv5x5s2_int8_requant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_requant_sse,          
            conv7x7s2_int8_requant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_func conv = 0;
    conv_int8_dequant_func conv_int8_dequant = 0;
    conv_int8_requant_func conv_int8_requant = 0;

    if (use_int8_inference)
    {
        if (use_int8_requantize)
            conv_int8_requant = conv_int8_requant_func_table[kernel_size-1][stride-1];
        else
            conv_int8_dequant = conv_int8_dequant_func_table[kernel_size-1][stride-1];  
        if ((!conv_int8_requant) && (!conv_int8_dequant))
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    // int8
    if (use_int8_inference)
    {         
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);

                // requantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }
            }
            else
                conv_int8_requant(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);

                // dequantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }
            }
            else
                conv_int8_dequant(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);     
        }

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;    

    if (use_winograd3x3)
    {
        //conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
        conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
    }
    else
        //conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}